

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutTruth.c
# Opt level: O0

uint Cut_TruthPhase(Csw_Cut_t *pCut,Csw_Cut_t *pCut1)

{
  int local_24;
  int local_20;
  int k;
  int i;
  uint uPhase;
  Csw_Cut_t *pCut1_local;
  Csw_Cut_t *pCut_local;
  
  k = 0;
  local_24 = 0;
  local_20 = 0;
  while ((local_20 < pCut->nFanins && (local_24 != pCut1->nFanins))) {
    if (*(int *)((long)&pCut1[1].pNext + (long)local_24 * 4) <=
        *(int *)((long)&pCut[1].pNext + (long)local_20 * 4)) {
      if (*(int *)((long)&pCut[1].pNext + (long)local_20 * 4) !=
          *(int *)((long)&pCut1[1].pNext + (long)local_24 * 4)) {
        __assert_fail("pCut->pFanins[i] == pCut1->pFanins[k]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswCut.c"
                      ,0x83,"unsigned int Cut_TruthPhase(Csw_Cut_t *, Csw_Cut_t *)");
      }
      k = 1 << ((byte)local_20 & 0x1f) | k;
      local_24 = local_24 + 1;
    }
    local_20 = local_20 + 1;
  }
  return k;
}

Assistant:

static inline unsigned Cut_TruthPhase( Cut_Cut_t * pCut, Cut_Cut_t * pCut1 )
{
    unsigned uPhase = 0;
    int i, k;
    for ( i = k = 0; i < (int)pCut->nLeaves; i++ )
    {
        if ( k == (int)pCut1->nLeaves )
            break;
        if ( pCut->pLeaves[i] < pCut1->pLeaves[k] )
            continue;
        assert( pCut->pLeaves[i] == pCut1->pLeaves[k] );
        uPhase |= (1 << i);
        k++;
    }
    return uPhase;
}